

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.h
# Opt level: O3

bool __thiscall
dap::json::JsonCppDeserializer::deserialize<dap::any>(JsonCppDeserializer *this,array<dap::any> *v)

{
  int iVar1;
  undefined4 extraout_var;
  size_t i;
  array<dap::any> **local_48;
  undefined8 *local_40;
  code *local_38;
  code *local_30;
  undefined8 local_28;
  array<dap::any> *local_20;
  
  local_20 = v;
  iVar1 = (*(this->super_Deserializer)._vptr_Deserializer[8])();
  std::vector<dap::any,_std::allocator<dap::any>_>::resize(v,CONCAT44(extraout_var,iVar1));
  local_40 = &local_28;
  local_28 = 0;
  local_30 = std::
             _Function_handler<bool_(dap::Deserializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/serialization.h:98:14)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(dap::Deserializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/serialization.h:98:14)>
             ::_M_manager;
  local_48 = &local_20;
  iVar1 = (*(this->super_Deserializer)._vptr_Deserializer[9])(this);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return SUB41(iVar1,0);
}

Assistant:

inline bool deserialize(dap::array<T>* v) const {
    return dap::Deserializer::deserialize(v);
  }